

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::tls1_channel_id_hash(SSL_HANDSHAKE *hs,uint8_t *out,size_t *out_len)

{
  SSL *ssl;
  ssl_session_st *psVar1;
  bool bVar2;
  uint16_t uVar3;
  ulong len;
  size_t hs_hash_len;
  SHA256_CTX ctx;
  uint8_t hs_hash [64];
  
  ssl = hs->ssl;
  uVar3 = ssl_protocol_version(ssl);
  if (uVar3 < 0x304) {
    SHA256_Init((SHA256_CTX *)&ctx);
    SHA256_Update((SHA256_CTX *)&ctx,"TLS Channel ID signature",0x19);
    if ((ssl->session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl != (ssl_session_st *)0x0) {
      SHA256_Update((SHA256_CTX *)&ctx,"Resumption",0xb);
      psVar1 = (ssl->session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
               _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
      len = (ulong)(psVar1->original_handshake_hash).size_;
      if (len == 0) {
        ERR_put_error(0x10,0,0x44,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0x1254);
        return false;
      }
      SHA256_Update((SHA256_CTX *)&ctx,&psVar1->original_handshake_hash,len);
    }
    bVar2 = SSLTranscript::GetHash(&hs->transcript,hs_hash,&hs_hash_len);
    if (bVar2) {
      SHA256_Update((SHA256_CTX *)&ctx,hs_hash,hs_hash_len);
      SHA256_Final(out,(SHA256_CTX *)&ctx);
      *out_len = 0x20;
    }
  }
  else {
    ctx.h[0] = 0;
    ctx.h[1] = 0;
    ctx.h[2] = 0;
    ctx.h[3] = 0;
    bVar2 = tls13_get_cert_verify_signature_input
                      (hs,(Array<unsigned_char> *)&ctx,ssl_cert_verify_channel_id);
    if (bVar2) {
      SHA256((uchar *)ctx.h._0_8_,ctx.h._8_8_,out);
      *out_len = 0x20;
    }
    Array<unsigned_char>::~Array((Array<unsigned_char> *)&ctx);
  }
  return bVar2;
}

Assistant:

bool tls1_channel_id_hash(SSL_HANDSHAKE *hs, uint8_t *out, size_t *out_len) {
  SSL *const ssl = hs->ssl;
  if (ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
    Array<uint8_t> msg;
    if (!tls13_get_cert_verify_signature_input(hs, &msg,
                                               ssl_cert_verify_channel_id)) {
      return false;
    }
    SHA256(msg.data(), msg.size(), out);
    *out_len = SHA256_DIGEST_LENGTH;
    return true;
  }

  SHA256_CTX ctx;

  SHA256_Init(&ctx);
  static const char kClientIDMagic[] = "TLS Channel ID signature";
  SHA256_Update(&ctx, kClientIDMagic, sizeof(kClientIDMagic));

  if (ssl->session != NULL) {
    static const char kResumptionMagic[] = "Resumption";
    SHA256_Update(&ctx, kResumptionMagic, sizeof(kResumptionMagic));
    if (ssl->session->original_handshake_hash.empty()) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }
    SHA256_Update(&ctx, ssl->session->original_handshake_hash.data(),
                  ssl->session->original_handshake_hash.size());
  }

  uint8_t hs_hash[EVP_MAX_MD_SIZE];
  size_t hs_hash_len;
  if (!hs->transcript.GetHash(hs_hash, &hs_hash_len)) {
    return false;
  }
  SHA256_Update(&ctx, hs_hash, (size_t)hs_hash_len);
  SHA256_Final(out, &ctx);
  *out_len = SHA256_DIGEST_LENGTH;
  return true;
}